

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_macro_expression.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionBinder::ReplaceMacroParameters
          (ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                *lambda_params)

{
  ExpressionClass EVar1;
  DummyBinding *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  pointer pPVar5;
  BaseExpression *pBVar6;
  ColumnRefExpression *this_01;
  string *psVar7;
  long lVar8;
  FunctionExpression *this_02;
  SubqueryExpression *pSVar9;
  pointer pSVar10;
  type node;
  type expr_00;
  _Any_data local_70;
  undefined1 local_60 [16];
  function<void_(duckdb::TableRef_&)> local_50;
  
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar5->super_BaseExpression).expression_class;
  if (EVar1 == SUBQUERY) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    pSVar9 = BaseExpression::Cast<duckdb::SubqueryExpression>(pBVar6);
    pSVar10 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(&pSVar9->subquery);
    node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                     (&pSVar10->node);
    local_60._8_8_ =
         ::std::
         _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_macro_expression.cpp:85:18)>
         ::_M_invoke;
    local_60._0_8_ =
         ::std::
         _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_macro_expression.cpp:85:18)>
         ::_M_manager;
    local_50.super__Function_base._M_functor._8_8_ =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.super__Function_base._M_functor._M_unused._M_object =
         ParsedExpressionIterator::DefaultRefCallback;
    local_50._M_invoker =
         ::std::_Function_handler<void_(duckdb::TableRef_&),_void_(*)(duckdb::TableRef_&)>::
         _M_invoke;
    local_50.super__Function_base._M_manager =
         ::std::_Function_handler<void_(duckdb::TableRef_&),_void_(*)(duckdb::TableRef_&)>::
         _M_manager;
    local_70._M_unused._M_object = this;
    local_70._8_8_ = lambda_params;
    ParsedExpressionIterator::EnumerateQueryNodeChildren
              (node,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                     *)&local_70,&local_50);
    if ((DummyBinding *)local_50.super__Function_base._M_manager != (DummyBinding *)0x0) {
      (*local_50.super__Function_base._M_manager)(&local_50,&local_50,3);
    }
    if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
      (*(code *)local_60._0_8_)(&local_70,&local_70,3);
    }
  }
  else if (EVar1 == FUNCTION) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    this_02 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar6);
    bVar4 = FunctionExpression::IsLambdaFunction(this_02);
    if (bVar4) {
      ReplaceMacroParametersInLambda(this,this_02,lambda_params);
      return;
    }
  }
  else if (EVar1 == COLUMN_REF) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar6);
    (*(this_01->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_70,this_01);
    bVar4 = LambdaExpression::IsLambdaParameter(lambda_params,(string *)&local_70);
    if ((ExpressionBinder *)local_70._M_unused._0_8_ != (ExpressionBinder *)local_60) {
      operator_delete(local_70._M_unused._M_object);
    }
    if (bVar4) {
      return;
    }
    bVar4 = ColumnRefExpression::IsQualified(this_01);
    if (bVar4) {
      psVar7 = ColumnRefExpression::GetTableName_abi_cxx11_(this_01);
      lVar8 = ::std::__cxx11::string::find((char *)psVar7,0x130adbf,0);
      if (lVar8 == -1) {
        return;
      }
    }
    else {
      optional_ptr<duckdb::DummyBinding,_true>::CheckValid(&this->macro_binding);
      this_00 = (this->macro_binding).ptr;
      psVar7 = ColumnRefExpression::GetColumnName_abi_cxx11_(this_01);
      bVar4 = Binding::HasMatchingBinding(&this_00->super_Binding,psVar7);
      if (!bVar4) {
        return;
      }
    }
    optional_ptr<duckdb::DummyBinding,_true>::CheckValid(&this->macro_binding);
    DummyBinding::ParamToArg
              ((DummyBinding *)&local_70,(ColumnRefExpression *)(this->macro_binding).ptr);
    uVar3 = local_70._M_unused._0_8_;
    local_70._M_unused._M_object = (long *)0x0;
    _Var2._M_head_impl =
         (expr->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (expr->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar3;
    if (_Var2._M_head_impl == (ParsedExpression *)0x0) {
      return;
    }
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    if ((long *)local_70._M_unused._0_8_ == (long *)0x0) {
      return;
    }
    (**(code **)(*local_70._M_unused._M_object + 8))();
    return;
  }
  expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator*(expr);
  local_60._8_8_ =
       ::std::
       _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_macro_expression.cpp:93:13)>
       ::_M_invoke;
  local_60._0_8_ =
       ::std::
       _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_macro_expression.cpp:93:13)>
       ::_M_manager;
  local_70._M_unused._M_object = this;
  local_70._8_8_ = lambda_params;
  ParsedExpressionIterator::EnumerateChildren
            (expr_00,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                      *)&local_70);
  if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
    (*(code *)local_60._0_8_)(&local_70,&local_70,3);
  }
  return;
}

Assistant:

void ExpressionBinder::ReplaceMacroParameters(unique_ptr<ParsedExpression> &expr,
                                              vector<unordered_set<string>> &lambda_params) {

	switch (expr->GetExpressionClass()) {
	case ExpressionClass::COLUMN_REF: {
		// If the expression is a column reference, we replace it with its argument.
		auto &col_ref = expr->Cast<ColumnRefExpression>();
		if (LambdaExpression::IsLambdaParameter(lambda_params, col_ref.GetName())) {
			return;
		}

		bool bind_macro_parameter = false;
		if (col_ref.IsQualified()) {
			if (col_ref.GetTableName().find(DummyBinding::DUMMY_NAME) != string::npos) {
				bind_macro_parameter = true;
			}
		} else {
			bind_macro_parameter = macro_binding->HasMatchingBinding(col_ref.GetColumnName());
		}

		if (bind_macro_parameter) {
			D_ASSERT(macro_binding->HasMatchingBinding(col_ref.GetColumnName()));
			expr = macro_binding->ParamToArg(col_ref);
		}
		return;
	}
	case ExpressionClass::FUNCTION: {
		// Special-handling for lambdas, which are inside function expressions.
		auto &function = expr->Cast<FunctionExpression>();
		if (function.IsLambdaFunction()) {
			return ReplaceMacroParametersInLambda(function, lambda_params);
		}
		break;
	}
	case ExpressionClass::SUBQUERY: {
		auto &sq = (expr->Cast<SubqueryExpression>()).subquery;
		ParsedExpressionIterator::EnumerateQueryNodeChildren(
		    *sq->node, [&](unique_ptr<ParsedExpression> &child) { ReplaceMacroParameters(child, lambda_params); });
		break;
	}
	default:
		break;
	}

	ParsedExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<ParsedExpression> &child) { ReplaceMacroParameters(child, lambda_params); });
}